

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,std::span<slang::syntax::VariableDimensionSyntax*,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,
          span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *args_1)

{
  pointer ppVVar1;
  size_t sVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  InstanceNameSyntax *pIVar8;
  long lVar9;
  uint uStack_24;
  
  pIVar8 = (InstanceNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceNameSyntax *)this->endPtr < pIVar8 + 1) {
    pIVar8 = (InstanceNameSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pIVar8 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar3 = args->info;
  ppVVar1 = args_1->_M_ptr;
  sVar2 = (args_1->_M_extent)._M_extent_value;
  (pIVar8->super_SyntaxNode).kind = InstanceName;
  (pIVar8->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pIVar8->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pIVar8->name).kind = TVar4;
  (pIVar8->name).field_0x2 = uVar5;
  (pIVar8->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar8->name).rawLen = uVar7;
  (pIVar8->name).info = pIVar3;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  *(ulong *)&(pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = (ulong)uStack_24
  ;
  *(undefined8 *)((long)&(pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.parent + 4) = 0;
  *(undefined4 *)((long)&(pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode + 4)
       = 0;
  (pIVar8->dimensions).super_SyntaxListBase.childCount = sVar2;
  (pIVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_ptr = ppVVar1;
  (pIVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pIVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cb68f8;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = &pIVar8->super_SyntaxNode;
  if (sVar2 != 0) {
    lVar9 = 0;
    do {
      *(InstanceNameSyntax **)(*(long *)((long)ppVVar1 + lVar9) + 8) = pIVar8;
      lVar9 = lVar9 + 8;
    } while (sVar2 << 3 != lVar9);
  }
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }